

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O0

void __thiscall
Imath_3_2::Box<Imath_3_2::Vec3<long>_>::extendBy
          (Box<Imath_3_2::Vec3<long>_> *this,Box<Imath_3_2::Vec3<long>_> *box)

{
  long *plVar1;
  long *in_RSI;
  long *in_RDI;
  
  plVar1 = std::min<long>(in_RDI,in_RSI);
  *in_RDI = *plVar1;
  plVar1 = std::min<long>(in_RDI + 1,in_RSI + 1);
  in_RDI[1] = *plVar1;
  plVar1 = std::min<long>(in_RDI + 2,in_RSI + 2);
  in_RDI[2] = *plVar1;
  plVar1 = std::max<long>(in_RDI + 3,in_RSI + 3);
  in_RDI[3] = *plVar1;
  plVar1 = std::max<long>(in_RDI + 4,in_RSI + 4);
  in_RDI[4] = *plVar1;
  plVar1 = std::max<long>(in_RDI + 5,in_RSI + 5);
  in_RDI[5] = *plVar1;
  return;
}

Assistant:

IMATH_HOSTDEVICE inline void
Box<Vec3<T>>::extendBy (const Box<Vec3<T>>& box) IMATH_NOEXCEPT
{
    min.x = std::min (min.x, box.min.x);
    min.y = std::min (min.y, box.min.y);
    min.z = std::min (min.z, box.min.z);
    max.x = std::max (max.x, box.max.x);
    max.y = std::max (max.y, box.max.y);
    max.z = std::max (max.z, box.max.z);
}